

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O2

void __thiscall cubeb_context_variables_Test::TestBody(cubeb_context_variables_Test *this)

{
  AssertionResult *pAVar1;
  int iVar2;
  anon_enum_32 *in_RCX;
  AssertionResult *this_00;
  char *message;
  AssertHelper *this_01;
  int r;
  uint32_t value;
  AssertionResult gtest_ar_;
  cubeb *ctx;
  AssertHelper local_58;
  undefined1 local_50 [8];
  String local_48;
  AssertionResult gtest_ar;
  
  r = common_init(&ctx,"test_context_variables");
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&gtest_ar_,in_RCX);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar2 = 0x7b;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)&gtest_ar,"ctx","nullptr",&ctx,(void **)&gtest_ar_);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0xac44000000;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000001;
      r = cubeb_get_min_latency(ctx,(cubeb_stream_params *)&gtest_ar,&value);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = r == -4 || r == 0;
      if ((r == -4) || (r == 0)) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        if (r == 0) {
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar_.success_ = value != 0;
          if (value == 0) {
            testing::Message::Message((Message *)local_50);
            testing::internal::GetBoolAssertionFailureMessage
                      ((internal *)(local_50 + 8),&gtest_ar_,"value > 0","false","true");
            iVar2 = 0x87;
            goto LAB_00108c94;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
        }
        r = cubeb_get_preferred_sample_rate(ctx,&value);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_.success_ = r == -4 || r == 0;
        if ((r == -4) || (r == 0)) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          if (r != 0) {
LAB_00108a9a:
            cubeb_destroy(ctx);
            return;
          }
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar_.success_ = value != 0;
          if (value != 0) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            goto LAB_00108a9a;
          }
          testing::Message::Message((Message *)local_50);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)(local_50 + 8),&gtest_ar_,"value > 0","false","true");
          iVar2 = 0x8d;
        }
        else {
          testing::Message::Message((Message *)local_50);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)(local_50 + 8),&gtest_ar_,
                     "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false","true");
          iVar2 = 0x8b;
        }
      }
      else {
        testing::Message::Message((Message *)local_50);
        testing::internal::GetBoolAssertionFailureMessage
                  ((internal *)(local_50 + 8),&gtest_ar_,
                   "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false","true");
        iVar2 = 0x85;
      }
LAB_00108c94:
      this_00 = (AssertionResult *)local_50;
      pAVar1 = &gtest_ar_;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,iVar2,local_48.c_str_);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::String::~String((String *)(local_50 + 8));
      goto LAB_00108b37;
    }
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar2 = 0x7c;
  }
  this_01 = (AssertHelper *)(local_50 + 8);
  pAVar1 = &gtest_ar;
  testing::internal::AssertHelper::AssertHelper
            (this_01,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
             ,iVar2,message);
  this_00 = &gtest_ar_;
  testing::internal::AssertHelper::operator=(this_01,(Message *)this_00);
  testing::internal::AssertHelper::~AssertHelper(this_01);
LAB_00108b37:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  return;
}

Assistant:

TEST(cubeb, context_variables)
{
  int r;
  cubeb * ctx;
  uint32_t value;
  cubeb_stream_params params;

  r = common_init(&ctx, "test_context_variables");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.channels = STREAM_CHANNELS;
  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_get_min_latency(ctx, &params, &value);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_TRUE(value > 0);
  }

  r = cubeb_get_preferred_sample_rate(ctx, &value);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_TRUE(value > 0);
  }

  cubeb_destroy(ctx);
}